

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O3

Vec4 __thiscall
tcu::TextureCubeArrayView::sample
          (TextureCubeArrayView *this,Sampler *sampler,float s,float t,float r,float q,float lod)

{
  ConstPixelBufferAccess *pCVar1;
  TextureFormat *pTVar2;
  WrapMode WVar3;
  uint uVar4;
  undefined4 numLevels;
  undefined8 uVar5;
  TextureFormat TVar6;
  undefined8 uVar7;
  int iVar8;
  int iVar9;
  Sampler *sampler_00;
  int iVar10;
  int iVar11;
  IVec3 *in_RDX;
  long lVar12;
  int iVar13;
  int iVar14;
  ConstPixelBufferAccess *level;
  CubeFace baseFace;
  Sampler *sampler_01;
  int i;
  ConstPixelBufferAccess *level_1;
  ConstPixelBufferAccess *pCVar15;
  long lVar16;
  int iVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float in_XMM4_Db;
  Vec4 VVar22;
  CubeFaceFloatCoords CVar23;
  undefined1 local_268 [16];
  undefined1 local_258 [24];
  undefined1 local_240 [16];
  TextureFormat local_230;
  int aiStack_228 [2];
  void *local_220;
  ConstPixelBufferAccess faceAccesses [6];
  ConstPixelBufferAccess faceAccesses1 [6];
  
  pCVar15 = faceAccesses;
  faceAccesses[0].m_format.type = (ChannelType)t;
  faceAccesses[0].m_format.order = (ChannelOrder)s;
  faceAccesses[0].m_size.m_data[0] = (int)r;
  CVar23 = getCubeFaceCoords((Vec3 *)pCVar15);
  fVar21 = CVar23.t;
  sampler_00 = CVar23._0_8_;
  fVar20 = CVar23.s;
  fVar18 = floorf(q + 0.5);
  iVar8 = (int)fVar18;
  iVar10 = *(int *)(*(long *)&sampler->wrapR + 0x10) / 6 + -1;
  if (iVar8 < iVar10) {
    iVar10 = iVar8;
  }
  iVar17 = 0;
  if (-1 < iVar8) {
    iVar17 = iVar10;
  }
  iVar10 = getCubeArrayFaceIndex(CVar23.face);
  if ((char)in_RDX[4].m_data[1] != '\x01') {
    numLevels = sampler->wrapR;
    faceAccesses[0].m_format.order = R;
    faceAccesses[0].m_format.type = SNORM_INT8;
    faceAccesses[0].m_size.m_data[0] = iVar10 + iVar17 * 6;
    VVar22 = sampleLevelArray2DOffset
                       ((ConstPixelBufferAccess *)this,numLevels,(Sampler *)(ulong)sampler->wrapS,
                        fVar20,fVar21,lod,in_RDX);
    lod = VVar22.m_data[2];
    in_XMM4_Db = VVar22.m_data[3];
    fVar20 = VVar22.m_data[0];
    fVar21 = VVar22.m_data[1];
    goto LAB_00a86d04;
  }
  sampler_01 = *(Sampler **)&sampler->wrapR;
  WVar3 = sampler->wrapS;
  iVar10 = getCubeArrayFaceIndex(CVar23.face);
  uVar4 = in_RDX[1].m_data[lod <= (float)in_RDX[1].m_data[2]];
  if (5 < uVar4) {
    fVar20 = 0.0;
    fVar21 = 0.0;
    *(undefined8 *)this = 0;
    this->m_levels = (ConstPixelBufferAccess *)0x0;
    goto LAB_00a86d04;
  }
  iVar17 = iVar17 * 6;
  iVar10 = iVar10 + iVar17;
  iVar8 = (int)in_RDX;
  switch(uVar4) {
  case 0:
    faceAccesses[0].m_size.m_data._0_8_ = *(undefined8 *)(in_RDX->m_data + 2);
    faceAccesses[0].m_size.m_data[2] = in_RDX[1].m_data[1];
    faceAccesses[0].m_pitch.m_data[0] = in_RDX[1].m_data[2];
    faceAccesses[0].m_pitch.m_data._4_8_ = *(undefined8 *)in_RDX[2].m_data;
    faceAccesses[0].m_data = *(void **)(in_RDX[2].m_data + 2);
    faceAccesses[1].m_size.m_data._4_8_ = *(undefined8 *)(in_RDX[4].m_data + 1);
    faceAccesses[1].m_size.m_data[0] = (int)((ulong)*(undefined8 *)(in_RDX[3].m_data + 2) >> 0x20);
    faceAccesses[1].m_format.order = (ChannelOrder)*(undefined8 *)(in_RDX[3].m_data + 1);
    faceAccesses[1].m_format.type =
         (ChannelType)((ulong)*(undefined8 *)(in_RDX[3].m_data + 1) >> 0x20);
    break;
  case 1:
    lVar12 = 8;
    do {
      *(undefined8 *)((long)faceAccesses[0].m_size.m_data + lVar12 + -0x10) = 0x2600000015;
      *(undefined8 *)((long)faceAccesses[0].m_size.m_data + lVar12 + -8) = 0;
      *(undefined8 *)((long)faceAccesses[0].m_size.m_data + lVar12) = 0;
      *(undefined8 *)((long)faceAccesses[0].m_size.m_data + lVar12 + 8) = 0;
      *(undefined8 *)((long)faceAccesses[0].m_pitch.m_data + lVar12 + 4) = 0;
      lVar12 = lVar12 + 0x28;
    } while (lVar12 != 0xf8);
    pCVar15 = faceAccesses;
    lVar12 = 0;
    do {
      iVar10 = getCubeArrayFaceIndex((CubeFace)lVar12);
      getSubregion(faceAccesses1,(ConstPixelBufferAccess *)sampler_01,0,0,iVar10 + iVar17,
                   ((IVec3 *)&sampler_01->wrapR)->m_data[0],sampler_01->minFilter,1);
      pCVar15->m_data = faceAccesses1[0].m_data;
      uVar7 = faceAccesses1[0].m_pitch.m_data._4_8_;
      TVar6 = faceAccesses1[0].m_format;
      uVar5 = CONCAT44(faceAccesses1[0].m_size.m_data[1],faceAccesses1[0].m_size.m_data[0]);
      *(undefined8 *)((pCVar15->m_size).m_data + 2) = faceAccesses1[0]._16_8_;
      *(undefined8 *)((pCVar15->m_pitch).m_data + 1) = uVar7;
      pCVar15->m_format = TVar6;
      *(undefined8 *)(pCVar15->m_size).m_data = uVar5;
      lVar12 = lVar12 + 1;
      pCVar15 = pCVar15 + 1;
    } while (lVar12 != 6);
    baseFace = (CubeFace)faceAccesses;
LAB_00a86cf1:
    VVar22 = sampleCubeSeamlessLinear
                       ((ConstPixelBufferAccess (*) [6])this,baseFace,sampler_00,fVar20,fVar21,iVar8
                       );
    lod = VVar22.m_data[2];
    in_XMM4_Db = VVar22.m_data[3];
    fVar20 = VVar22.m_data[0];
    fVar21 = VVar22.m_data[1];
    goto LAB_00a86d04;
  default:
    iVar13 = WVar3 - CLAMP_TO_BORDER;
    fVar18 = ceilf(lod + 0.5);
    iVar14 = (int)fVar18 + -1;
    if (iVar14 < iVar13) {
      iVar13 = iVar14;
    }
    iVar11 = 0;
    if (-1 < iVar14) {
      iVar11 = iVar13;
    }
    if (uVar4 == 4) {
      lVar12 = 8;
      do {
        *(undefined8 *)((long)faceAccesses[0].m_size.m_data + lVar12 + -0x10) = 0x2600000015;
        *(undefined8 *)((long)faceAccesses[0].m_size.m_data + lVar12 + -8) = 0;
        *(undefined8 *)((long)faceAccesses[0].m_size.m_data + lVar12) = 0;
        *(undefined8 *)((long)faceAccesses[0].m_size.m_data + lVar12 + 8) = 0;
        *(undefined8 *)((long)faceAccesses[0].m_pitch.m_data + lVar12 + 4) = 0;
        lVar12 = lVar12 + 0x28;
      } while (lVar12 != 0xf8);
      pCVar1 = (ConstPixelBufferAccess *)((TextureFormat *)&sampler_01->wrapS + (long)iVar11 * 5);
      lVar12 = 0;
      do {
        iVar10 = getCubeArrayFaceIndex((CubeFace)lVar12);
        getSubregion(faceAccesses1,pCVar1,0,0,iVar10 + iVar17,(pCVar1->m_size).m_data[0],
                     (pCVar1->m_size).m_data[1],1);
        pCVar15->m_data = faceAccesses1[0].m_data;
        uVar7 = faceAccesses1[0].m_pitch.m_data._4_8_;
        TVar6 = faceAccesses1[0].m_format;
        uVar5 = CONCAT44(faceAccesses1[0].m_size.m_data[1],faceAccesses1[0].m_size.m_data[0]);
        *(undefined8 *)((pCVar15->m_size).m_data + 2) = faceAccesses1[0]._16_8_;
        *(undefined8 *)((pCVar15->m_pitch).m_data + 1) = uVar7;
        pCVar15->m_format = TVar6;
        *(undefined8 *)(pCVar15->m_size).m_data = uVar5;
        lVar12 = lVar12 + 1;
        pCVar15 = pCVar15 + 1;
      } while (lVar12 != 6);
      baseFace = (CubeFace)faceAccesses;
      goto LAB_00a86cf1;
    }
    sampler_01 = (Sampler *)((TextureFormat *)&sampler_01->wrapS + (long)iVar11 * 5);
    faceAccesses[0].m_size.m_data._0_8_ = *(undefined8 *)(in_RDX->m_data + 2);
    faceAccesses[0].m_size.m_data[2] = in_RDX[1].m_data[1];
    faceAccesses[0].m_pitch.m_data[0] = in_RDX[1].m_data[2];
    faceAccesses[0].m_pitch.m_data._4_8_ = *(undefined8 *)in_RDX[2].m_data;
    faceAccesses[0].m_data = *(void **)(in_RDX[2].m_data + 2);
    faceAccesses[1].m_size.m_data._4_8_ = *(undefined8 *)(in_RDX[4].m_data + 1);
    faceAccesses[1].m_size.m_data[0] = (int)((ulong)*(undefined8 *)(in_RDX[3].m_data + 2) >> 0x20);
    faceAccesses[1].m_format.order = (ChannelOrder)*(undefined8 *)(in_RDX[3].m_data + 1);
    faceAccesses[1].m_format.type =
         (ChannelType)((ulong)*(undefined8 *)(in_RDX[3].m_data + 1) >> 0x20);
    break;
  case 3:
  case 5:
    iVar14 = WVar3 - CLAMP_TO_BORDER;
    fVar18 = floorf(lod);
    iVar11 = (int)fVar18;
    iVar13 = iVar14;
    if (iVar11 < iVar14) {
      iVar13 = iVar11;
    }
    iVar9 = 0;
    if (-1 < iVar11) {
      iVar9 = iVar13;
    }
    if (iVar9 + 1 <= iVar14) {
      iVar14 = iVar9 + 1;
    }
    fVar18 = lod - fVar18;
    local_258._0_4_ = R;
    local_258._4_4_ = SNORM_INT8;
    local_258._8_4_ = 0;
    local_258._12_4_ = 0;
    local_268._0_4_ = R;
    local_268._4_4_ = SNORM_INT8;
    local_268._8_4_ = 0;
    local_268._12_4_ = 0;
    if (uVar4 == 5) {
      lVar12 = 8;
      do {
        *(undefined8 *)((long)faceAccesses[0].m_size.m_data + lVar12 + -0x10) = 0x2600000015;
        *(undefined8 *)((long)faceAccesses[0].m_size.m_data + lVar12 + -8) = 0;
        *(undefined8 *)((long)faceAccesses[0].m_size.m_data + lVar12) = 0;
        *(undefined8 *)((long)faceAccesses[0].m_size.m_data + lVar12 + 8) = 0;
        *(undefined8 *)((long)faceAccesses[0].m_pitch.m_data + lVar12 + 4) = 0;
        lVar12 = lVar12 + 0x28;
      } while (lVar12 != 0xf8);
      lVar12 = 8;
      do {
        *(undefined8 *)((long)(&faceAccesses[5].m_pitch + 1) + lVar12) = 0x2600000015;
        *(undefined8 *)((long)faceAccesses1[0].m_size.m_data + lVar12 + -8) = 0;
        *(undefined8 *)((long)faceAccesses1[0].m_size.m_data + lVar12) = 0;
        *(undefined8 *)((long)faceAccesses1[0].m_size.m_data + lVar12 + 8) = 0;
        *(undefined8 *)((long)faceAccesses1[0].m_pitch.m_data + lVar12 + 4) = 0;
        lVar12 = lVar12 + 0x28;
      } while (lVar12 != 0xf8);
      pCVar15 = (ConstPixelBufferAccess *)((TextureFormat *)&sampler_01->wrapS + (long)iVar9 * 5);
      pCVar1 = (ConstPixelBufferAccess *)((TextureFormat *)&sampler_01->wrapS + (long)iVar14 * 5);
      lVar16 = 0;
      lVar12 = 0;
      do {
        iVar10 = getCubeArrayFaceIndex((CubeFace)lVar12);
        getSubregion((ConstPixelBufferAccess *)local_240,pCVar15,0,0,iVar10 + iVar17,
                     (pCVar15->m_size).m_data[0],(pCVar15->m_size).m_data[1],1);
        *(void **)((long)(&faceAccesses[0].m_pitch + 1) + lVar16) = local_220;
        *(TextureFormat *)((long)faceAccesses[0].m_size.m_data + lVar16 + 8) = local_230;
        *(int (*) [2])((long)faceAccesses[0].m_pitch.m_data + lVar16 + 4) = aiStack_228;
        pTVar2 = (TextureFormat *)((long)faceAccesses[0].m_size.m_data + lVar16 + -8);
        pTVar2->order = local_240._0_4_;
        pTVar2->type = local_240._4_4_;
        *(undefined8 *)((long)faceAccesses[0].m_size.m_data + lVar16) = local_240._8_8_;
        iVar10 = getCubeArrayFaceIndex((CubeFace)lVar12);
        getSubregion((ConstPixelBufferAccess *)local_240,pCVar1,0,0,iVar10 + iVar17,
                     (pCVar1->m_size).m_data[0],(pCVar1->m_size).m_data[1],1);
        *(void **)((long)(&faceAccesses1[0].m_pitch + 1) + lVar16) = local_220;
        *(TextureFormat *)((long)faceAccesses1[0].m_size.m_data + lVar16 + 8) = local_230;
        *(int (*) [2])((long)faceAccesses1[0].m_pitch.m_data + lVar16 + 4) = aiStack_228;
        pTVar2 = (TextureFormat *)((long)faceAccesses1[0].m_size.m_data + lVar16 + -8);
        pTVar2->order = local_240._0_4_;
        pTVar2->type = local_240._4_4_;
        *(undefined8 *)((long)faceAccesses1[0].m_size.m_data + lVar16) = local_240._8_8_;
        lVar12 = lVar12 + 1;
        lVar16 = lVar16 + 0x28;
      } while (lVar12 != 6);
      sampleCubeSeamlessLinear
                ((ConstPixelBufferAccess (*) [6])local_258,(CubeFace)faceAccesses,
                 (Sampler *)((ulong)sampler_00 & 0xffffffff),fVar20,fVar21,iVar8);
      sampleCubeSeamlessLinear
                ((ConstPixelBufferAccess (*) [6])local_268,(CubeFace)faceAccesses1,
                 (Sampler *)((ulong)sampler_00 & 0xffffffff),fVar20,fVar21,iVar8);
    }
    else {
      faceAccesses[0].m_size.m_data._0_8_ = *(undefined8 *)(in_RDX->m_data + 2);
      faceAccesses[0].m_size.m_data[2] = in_RDX[1].m_data[1];
      faceAccesses[0].m_pitch.m_data[0] = in_RDX[1].m_data[2];
      faceAccesses[0].m_pitch.m_data._4_8_ = *(undefined8 *)in_RDX[2].m_data;
      faceAccesses[0].m_data = *(void **)(in_RDX[2].m_data + 2);
      faceAccesses[1].m_size.m_data._4_8_ = *(undefined8 *)(in_RDX[4].m_data + 1);
      faceAccesses[1].m_size.m_data[0] = (int)((ulong)*(undefined8 *)(in_RDX[3].m_data + 2) >> 0x20)
      ;
      faceAccesses[1].m_format.order = (ChannelOrder)*(undefined8 *)(in_RDX[3].m_data + 1);
      faceAccesses[1].m_format.type =
           (ChannelType)((ulong)*(undefined8 *)(in_RDX[3].m_data + 1) >> 0x20);
      faceAccesses[0].m_format.order = R;
      faceAccesses[0].m_format.type = SNORM_INT8;
      faceAccesses1[0].m_format.order = R;
      faceAccesses1[0].m_format.type = SNORM_INT8;
      faceAccesses1[0].m_size.m_data[0] = iVar10;
      ConstPixelBufferAccess::sample2DOffset
                ((ConstPixelBufferAccess *)local_258,
                 (Sampler *)((TextureFormat *)&sampler_01->wrapS + (long)iVar9 * 5),
                 (FilterMode)faceAccesses,fVar20,fVar21,(IVec3 *)0x0);
      faceAccesses[0].m_size.m_data._0_8_ = *(undefined8 *)(in_RDX->m_data + 2);
      faceAccesses[0].m_size.m_data[2] = in_RDX[1].m_data[1];
      faceAccesses[0].m_pitch.m_data[0] = in_RDX[1].m_data[2];
      faceAccesses[0].m_pitch.m_data._4_8_ = *(undefined8 *)in_RDX[2].m_data;
      faceAccesses[0].m_data = *(void **)(in_RDX[2].m_data + 2);
      faceAccesses[1].m_size.m_data._4_8_ = *(undefined8 *)(in_RDX[4].m_data + 1);
      faceAccesses[1].m_size.m_data[0] = (int)((ulong)*(undefined8 *)(in_RDX[3].m_data + 2) >> 0x20)
      ;
      faceAccesses[1].m_format.order = (ChannelOrder)*(undefined8 *)(in_RDX[3].m_data + 1);
      faceAccesses[1].m_format.type =
           (ChannelType)((ulong)*(undefined8 *)(in_RDX[3].m_data + 1) >> 0x20);
      faceAccesses[0].m_format.order = R;
      faceAccesses[0].m_format.type = SNORM_INT8;
      faceAccesses1[0].m_format.order = R;
      faceAccesses1[0].m_format.type = SNORM_INT8;
      faceAccesses1[0].m_size.m_data[0] = iVar10;
      ConstPixelBufferAccess::sample2DOffset
                ((ConstPixelBufferAccess *)local_268,
                 (Sampler *)((TextureFormat *)&sampler_01->wrapS + (long)iVar14 * 5),
                 (FilterMode)faceAccesses,fVar20,fVar21,(IVec3 *)0x0);
    }
    fVar19 = 1.0 - fVar18;
    fVar20 = fVar19 * (float)local_258._0_4_;
    fVar21 = fVar19 * (float)local_258._4_4_;
    lod = fVar18 * (float)local_268._0_4_ + fVar20;
    in_XMM4_Db = fVar18 * (float)local_268._4_4_ + fVar21;
    this->m_numLevels = (int)lod;
    *(float *)&this->field_0x4 = in_XMM4_Db;
    *(float *)&this->m_levels = fVar18 * (float)local_268._8_4_ + fVar19 * (float)local_258._8_4_;
    *(float *)((long)&this->m_levels + 4) =
         fVar18 * (float)local_268._12_4_ + fVar19 * (float)local_258._12_4_;
    goto LAB_00a86d04;
  }
  faceAccesses1[0].m_format.order = R;
  faceAccesses1[0].m_format.type = SNORM_INT8;
  faceAccesses[0].m_format.order = R;
  faceAccesses[0].m_format.type = SNORM_INT8;
  faceAccesses1[0].m_size.m_data[0] = iVar10;
  VVar22 = ConstPixelBufferAccess::sample2DOffset
                     ((ConstPixelBufferAccess *)this,sampler_01,(FilterMode)faceAccesses,fVar20,
                      fVar21,(IVec3 *)0x0);
  lod = VVar22.m_data[2];
  in_XMM4_Db = VVar22.m_data[3];
  fVar20 = VVar22.m_data[0];
  fVar21 = VVar22.m_data[1];
LAB_00a86d04:
  VVar22.m_data[1] = fVar21;
  VVar22.m_data[0] = fVar20;
  VVar22.m_data[3] = in_XMM4_Db;
  VVar22.m_data[2] = lod;
  return (Vec4)VVar22.m_data;
}

Assistant:

tcu::Vec4 TextureCubeArrayView::sample (const Sampler& sampler, float s, float t, float r, float q, float lod) const
{
	const CubeFaceFloatCoords	coords		= getCubeFaceCoords(Vec3(s, t, r));
	const int					layer		= selectLayer(q);
	const int					faceDepth	= (layer * 6) + getCubeArrayFaceIndex(coords.face);

	DE_ASSERT(sampler.compare == Sampler::COMPAREMODE_NONE);

	if (sampler.seamlessCubeMap)
		return sampleCubeArraySeamless(m_levels, m_numLevels, layer, coords.face, sampler, coords.s, coords.t, lod);
	else
		return sampleLevelArray2D(m_levels, m_numLevels, sampler, coords.s, coords.t, faceDepth, lod);
}